

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<unsigned_int,fmt::v5::basic_format_specs<wchar_t>>::hex_writer>
::operator()(padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<unsigned_int,fmt::v5::basic_format_specs<wchar_t>>::hex_writer>
             *this,wchar_t **it)

{
  undefined4 uVar1;
  int iVar2;
  bool bVar3;
  wchar_t *pwVar4;
  wchar_t *pwVar5;
  long lVar6;
  char *pcVar7;
  uint uVar8;
  long lVar9;
  
  lVar6 = *(long *)(this + 0x10);
  if (lVar6 != 0) {
    pwVar4 = *it;
    if (0 < lVar6) {
      pcVar7 = *(char **)(this + 8);
      lVar6 = lVar6 + 1;
      do {
        *pwVar4 = (int)*pcVar7;
        pcVar7 = pcVar7 + 1;
        pwVar4 = pwVar4 + 1;
        lVar6 = lVar6 + -1;
      } while (1 < lVar6);
    }
    *it = pwVar4;
  }
  pwVar5 = *it;
  lVar6 = *(long *)(this + 0x20);
  pwVar4 = pwVar5;
  if (lVar6 != 0) {
    pwVar4 = pwVar5 + lVar6;
    uVar1 = *(undefined4 *)(this + 0x18);
    lVar9 = 0;
    do {
      *(undefined4 *)((long)pwVar5 + lVar9) = uVar1;
      lVar9 = lVar9 + 4;
    } while (lVar6 << 2 != lVar9);
  }
  *it = pwVar4;
  iVar2 = *(int *)(this + 0x30);
  pcVar7 = "0123456789ABCDEF";
  if (*(char *)(*(long *)(*(long *)(this + 0x28) + 8) + 0x11) == 'x') {
    pcVar7 = "0123456789abcdef";
  }
  pwVar5 = pwVar4 + iVar2;
  uVar8 = *(uint *)(*(long *)(this + 0x28) + 0x10);
  do {
    pwVar5 = pwVar5 + -1;
    *pwVar5 = (int)pcVar7[uVar8 & 0xf];
    bVar3 = 0xf < uVar8;
    uVar8 = uVar8 >> 4;
  } while (bVar3);
  *it = pwVar4 + iVar2;
  return;
}

Assistant:

FMT_CONSTEXPR size_t size() const { return size_; }